

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::SubDFriendlyTag(ON_NurbsCurve *this)

{
  bool bVar1;
  ON_NurbsCurve *this_local;
  
  if ((this->m_knot_capacity_and_tags & 0x80000000) != 0) {
    bVar1 = IsSubDFriendly(this,true);
    if (bVar1) {
      return true;
    }
    SetSubDFriendlyTag(this,false);
  }
  return false;
}

Assistant:

bool ON_NurbsCurve::SubDFriendlyTag() const
{
  if (0 != (m_knot_capacity_and_tags & ON_NurbsCurve::masks::subdfriendly_tag))
  {
    if (IsSubDFriendly(true))
      return true;
    // Something modified NURBS properties after the tag was set.
    const_cast<ON_NurbsCurve*>(this)->SetSubDFriendlyTag(false);
  }
  return false;
}